

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  pointer ppVar1;
  pointer pcVar2;
  cmState *this_00;
  string *psVar3;
  ostream *poVar4;
  pointer ppVar5;
  char *pcVar6;
  cmListFileContext lfc;
  cmStateDirectory cmDir;
  undefined1 local_c8 [32];
  string local_a8;
  long local_88;
  cmTarget *local_80;
  string local_78;
  cmStateDirectory local_58;
  
  pcVar6 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar6 = "keyword";
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"The uses of the ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (s,pcVar6,(ulong)(sig == KeywordTLLSignature) * 2 + 5);
  std::__ostream_insert<char,std::char_traits<char>>(s," signature are here:\n",0x15);
  cmMakefile::GetStateSnapshot(this->Makefile);
  cmStateSnapshot::GetDirectory(&local_58,(cmStateSnapshot *)local_c8);
  ppVar5 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    local_80 = this;
    do {
      if (ppVar5->first == sig) {
        local_c8._0_8_ = local_c8 + 0x10;
        pcVar2 = (ppVar5->second).Name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c8,pcVar2,pcVar2 + (ppVar5->second).Name._M_string_length);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        pcVar2 = (ppVar5->second).FilePath._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar2,pcVar2 + (ppVar5->second).FilePath._M_string_length);
        local_88 = (ppVar5->second).Line;
        this_00 = cmMakefile::GetState(local_80->Makefile);
        psVar3 = cmState::GetSourceDirectory_abi_cxx11_(this_00);
        cmStateDirectory::ConvertToRelPathIfNotContained(&local_78,&local_58,psVar3,&local_a8);
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(s," * ",3);
        poVar4 = operator<<(s,(cmListFileContext *)local_c8);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((cmState *)local_c8._0_8_ != (cmState *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  cmStateDirectory cmDir =
    this->GetMakefile()->GetStateSnapshot().GetDirectory();
  for (auto const& cmd : this->TLLCommands) {
    if (cmd.first == sig) {
      cmListFileContext lfc = cmd.second;
      lfc.FilePath = cmDir.ConvertToRelPathIfNotContained(
        this->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << std::endl;
    }
  }
}